

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTSDA::CreateJacobianMatrices(ChLinkTSDA *this)

{
  ChBodyFrame *pCVar1;
  SpringJacobians *pSVar2;
  long lVar3;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> variables_list;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_30;
  ChVariablesGenericDiagonalMass *local_18;
  
  pSVar2 = (SpringJacobians *)::operator_new(0x80);
  (pSVar2->m_KRM).super_ChKblock._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_01186748;
  (pSVar2->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (pSVar2->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0;
  (pSVar2->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 0;
  (pSVar2->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar2->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar2->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar2->m_J).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pSVar2->m_J).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pSVar2->m_J).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pSVar2->m_J).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  (pSVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pSVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pSVar2->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  (pSVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pSVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pSVar2->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  local_48._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
  this->m_jacobians = pSVar2;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->super_ChLink).Body1;
  (**(code **)((long)*(double *)
                      ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x200))
            ((double *)
             ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40));
  pCVar1 = (this->super_ChLink).Body2;
  (**(code **)((long)*(double *)
                      ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data + 0x40) + 0x200))
            ((double *)
             ((long)&pCVar1[-1].super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),&local_48);
  if (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0) {
    local_18 = this->m_variables;
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_48,
               (ChVariables **)&local_18);
  }
  pSVar2 = this->m_jacobians;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_30,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_48);
  ChKblockGeneric::SetVariables
            (&pSVar2->m_KRM,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_30);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_30);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&(this->m_jacobians->m_J).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)this->m_nstates
             ,(long)this->m_nstates);
  lVar3 = (long)this->m_nstates + 0xc;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&(this->m_jacobians->m_K).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,lVar3,lVar3);
  lVar3 = (long)this->m_nstates + 0xc;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&(this->m_jacobians->m_R).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,lVar3,lVar3);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void ChLinkTSDA::CreateJacobianMatrices() {
    m_jacobians = new SpringJacobians;

    // Collect all variables associated with this element
    std::vector<ChVariables*> variables_list;
    static_cast<ChBody*>(Body1)->LoadableGetVariables(variables_list);
    static_cast<ChBody*>(Body2)->LoadableGetVariables(variables_list);
    if (m_variables) {
        variables_list.push_back(m_variables);
    }

    // Set the associated variables in the underlying KRM block
    m_jacobians->m_KRM.SetVariables(variables_list);

    // Resize matrices
    m_jacobians->m_J.resize(m_nstates, m_nstates);
    m_jacobians->m_K.resize(12 + m_nstates, 12 + m_nstates);
    m_jacobians->m_R.resize(12 + m_nstates, 12 + m_nstates);
}